

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

void __thiscall
arangodb::velocypack::Validator::validateUnindexedArray(Validator *this,uint8_t *ptr,size_t length)

{
  uint uVar1;
  ValueLength VVar2;
  ulong uVar3;
  Exception *this_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *msg;
  long lVar7;
  byte *pbVar8;
  size_t length_00;
  byte *local_40;
  Validator *local_38;
  
  lVar7 = 1L << (*ptr - 2 & 0x3f);
  local_38 = this;
  validateBufferLength(this,lVar7 + 2,length,true);
  switch(lVar7) {
  case 1:
    uVar3 = (ulong)ptr[1];
    break;
  case 2:
    uVar3 = (ulong)*(ushort *)(ptr + 1);
    break;
  case 3:
    uVar4 = (ulong)((uint)ptr[2] << 8 | (uint)ptr[3] << 0x10);
    uVar3 = (ulong)ptr[1];
    goto LAB_0011508e;
  case 4:
    uVar3 = (ulong)*(uint *)(ptr + 1);
    break;
  case 5:
    uVar1 = *(uint *)(ptr + 1);
    uVar3 = (ulong)ptr[5];
    goto LAB_00115070;
  case 6:
    uVar1 = *(uint *)(ptr + 1);
    uVar3 = (ulong)*(ushort *)(ptr + 5);
LAB_00115070:
    uVar3 = uVar3 << 0x20 | (ulong)uVar1;
    break;
  case 7:
    uVar4 = (ulong)*(uint3 *)(ptr + 5) << 0x20;
    uVar3 = (ulong)*(uint *)(ptr + 1);
LAB_0011508e:
    uVar3 = uVar3 | uVar4;
    break;
  case 8:
    uVar3 = *(ulong *)(ptr + 1);
    break;
  default:
    uVar3 = 0;
  }
  if (length < uVar3) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Array length is out of bounds";
  }
  else {
    uVar4 = lVar7 + 1;
    uVar6 = 9;
    if ((long)uVar3 < 9) {
      uVar6 = uVar3;
    }
    if ((long)uVar4 < (long)uVar6) {
      pbVar8 = ptr + uVar6;
      uVar5 = uVar4;
      do {
        if (ptr[uVar5] != '\0') {
          pbVar8 = ptr + uVar5;
          uVar6 = uVar5;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
    else {
      pbVar8 = ptr + lVar7 + 1;
      uVar6 = uVar4;
    }
    uVar5 = uVar3 - uVar6;
    if (uVar5 == 0 || (long)uVar3 < (long)uVar6) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array structure is invalid";
    }
    else if (uVar6 == 9 || uVar6 == uVar4) {
      validatePart(local_38,pbVar8,length - uVar6,true);
      VVar2 = (ValueLength)"\x01\x01"[*pbVar8];
      local_40 = pbVar8;
      if (VVar2 == 0) {
        VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_40,pbVar8);
      }
      if (VVar2 == 0) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Array itemSize value is invalid";
      }
      else if (uVar5 < VVar2) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Array nrItems value is invalid";
      }
      else {
        uVar5 = uVar5 / VVar2;
        pbVar8 = pbVar8 + VVar2;
        length_00 = (long)(ptr + length) - (long)pbVar8;
        do {
          uVar5 = uVar5 - 1;
          if (uVar5 == 0) {
            return;
          }
          if (ptr + length <= pbVar8) {
            this_00 = (Exception *)__cxa_allocate_exception(0x18);
            msg = "Array value is out of bounds";
            goto LAB_001151ed;
          }
          validatePart(local_38,pbVar8,length_00,true);
          uVar3 = (ulong)"\x01\x01"[*pbVar8];
          local_40 = pbVar8;
          if (uVar3 == 0) {
            uVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&local_40,pbVar8);
          }
          pbVar8 = pbVar8 + VVar2;
          length_00 = length_00 - VVar2;
        } while (uVar3 == VVar2);
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Unexpected Array value length";
      }
    }
    else {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array padding is invalid";
    }
  }
LAB_001151ed:
  Exception::Exception(this_00,ValidatorInvalidLength,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateUnindexedArray(uint8_t const* ptr, std::size_t length) {
  // Array without index table, with 1-8 bytes lengths, all values with same
  // length
  uint8_t head = *ptr;
  ValueLength const byteSizeLength =
      1ULL << (static_cast<ValueLength>(head) - 0x02U);
  validateBufferLength(1 + byteSizeLength + 1, length, true);
  ValueLength const byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length is out of bounds");
  }

  // look up first member
  uint8_t const* p = ptr + 1 + byteSizeLength;
  uint8_t const* e = p + (8 - byteSizeLength);

  if (e > ptr + byteSize) {
    e = ptr + byteSize;
  }
  while (p < e && *p == '\x00') {
    ++p;
  }

  if (p >= ptr + byteSize) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array structure is invalid");
  }

  // check if padding is correct
  if (p != ptr + 1 + byteSizeLength &&
      p != ptr + 1 + byteSizeLength + (8 - byteSizeLength)) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array padding is invalid");
  }

  validatePart(p, length - (p - ptr), true);
  ValueLength itemSize = Slice(p).byteSize();
  if (itemSize == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array itemSize value is invalid");
  }
  ValueLength nrItems = (byteSize - (p - ptr)) / itemSize;

  if (nrItems == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array nrItems value is invalid");
  }
  // we already validated p, so move it forward
  p += itemSize;
  e = ptr + length;
  --nrItems;

  while (nrItems > 0) {
    if (p >= e) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array value is out of bounds");
    }
    // validate sub value
    validatePart(p, e - p, true);
    if (Slice(p).byteSize() != itemSize) {
      // got a sub-object with a different size. this is not allowed
      throw Exception(Exception::ValidatorInvalidLength,
                      "Unexpected Array value length");
    }
    p += itemSize;
    --nrItems;
  }
}